

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

size_t __thiscall
std::hash<google::protobuf::MapKey>::operator()
          (hash<google::protobuf::MapKey> *this,MapKey *map_key)

{
  bool bVar1;
  CppType CVar2;
  uint32_t uVar3;
  int32_t iVar4;
  LogMessage *pLVar5;
  uint64_t uVar6;
  string *__s;
  size_t sVar7;
  LogFinisher local_41;
  LogMessage local_40;
  
  CVar2 = google::protobuf::MapKey::type(map_key);
  switch(CVar2) {
  case CPPTYPE_INT32:
    google::protobuf::MapKey::GetInt32Value(map_key);
    iVar4 = google::protobuf::MapKey::GetInt32Value(map_key);
    sVar7 = (size_t)iVar4;
    break;
  case CPPTYPE_INT64:
    sVar7 = google::protobuf::MapKey::GetInt64Value(map_key);
    return sVar7;
  case CPPTYPE_UINT32:
    google::protobuf::MapKey::GetUInt32Value(map_key);
    uVar3 = google::protobuf::MapKey::GetUInt32Value(map_key);
    sVar7 = (size_t)uVar3;
    break;
  case CPPTYPE_UINT64:
    google::protobuf::MapKey::GetUInt64Value(map_key);
    uVar6 = google::protobuf::MapKey::GetUInt64Value(map_key);
    return uVar6;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    google::protobuf::internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x117);
    pLVar5 = google::protobuf::internal::LogMessage::operator<<(&local_40,"Unsupported");
    google::protobuf::internal::LogFinisher::operator=(&local_41,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage(&local_40);
  default:
    google::protobuf::internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x12f);
    pLVar5 = google::protobuf::internal::LogMessage::operator<<(&local_40,"Can\'t get here.");
    google::protobuf::internal::LogFinisher::operator=(&local_41,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage(&local_40);
    sVar7 = 0;
    break;
  case CPPTYPE_BOOL:
    bVar1 = google::protobuf::MapKey::GetBoolValue(map_key);
    sVar7 = (size_t)bVar1;
    break;
  case CPPTYPE_STRING:
    __s = google::protobuf::MapKey::GetStringValue_abi_cxx11_(map_key);
    sVar7 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,__s);
  }
  return sVar7;
}

Assistant:

size_t operator()(const ::PROTOBUF_NAMESPACE_ID::MapKey& map_key) const {
    switch (map_key.type()) {
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_DOUBLE:
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_FLOAT:
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_ENUM:
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        break;
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_STRING:
        return hash<std::string>()(map_key.GetStringValue());
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_INT64: {
        auto value = map_key.GetInt64Value();
        return hash<decltype(value)>()(value);
      }
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_INT32: {
        auto value = map_key.GetInt32Value();
        return hash<decltype(value)>()(map_key.GetInt32Value());
      }
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_UINT64: {
        auto value = map_key.GetUInt64Value();
        return hash<decltype(value)>()(map_key.GetUInt64Value());
      }
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_UINT32: {
        auto value = map_key.GetUInt32Value();
        return hash<decltype(value)>()(map_key.GetUInt32Value());
      }
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_BOOL: {
        return hash<bool>()(map_key.GetBoolValue());
      }
    }
    GOOGLE_LOG(FATAL) << "Can't get here.";
    return 0;
  }